

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  iVar1 = (int)end;
  if (end <= ptr) {
    return -4;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    *nextTokPtr = ptr;
    return 0;
  default:
    end_local = ptr + 1;
    break;
  case 4:
    end_local = ptr + 1;
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    if (*end_local == ']') {
      if ((long)end - (long)(ptr + 2) < 1) {
        return -1;
      }
      if (ptr[2] == '>') {
        *nextTokPtr = ptr + 3;
        return 0x28;
      }
      end_local = ptr + 1;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar1 = (*enc[3].nameLength)(enc,ptr);
    if (iVar1 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    iVar1 = extraout_EDX;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar2 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar2 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    iVar1 = extraout_EDX_00;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar1 = (*enc[3].getAtts)(enc,ptr,iVar1,(ATTRIBUTE *)ptr);
    if (iVar1 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    iVar1 = extraout_EDX_01;
    break;
  case 9:
    end_local = ptr + 1;
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    if (*(char *)((long)enc[1].scanners + (ulong)(byte)*end_local) == '\n') {
      end_local = ptr + 2;
    }
    *nextTokPtr = end_local;
    return 7;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  }
  do {
    if ((long)end - (long)end_local < 1) {
      *nextTokPtr = end_local;
      return 6;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 0:
    case 1:
    case 4:
    case 8:
    case 9:
    case 10:
      *nextTokPtr = end_local;
      return 6;
    default:
      end_local = end_local + 1;
      break;
    case 5:
      if (((long)end - (long)end_local < 2) ||
         (iVar1 = (*enc[3].nameLength)(enc,end_local), iVar1 != 0)) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 2;
      iVar1 = extraout_EDX_02;
      break;
    case 6:
      if (((long)end - (long)end_local < 3) ||
         (pcVar2 = (*enc[3].skipS)(enc,end_local), (int)pcVar2 != 0)) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 3;
      iVar1 = extraout_EDX_03;
      break;
    case 7:
      if (((long)end - (long)end_local < 4) ||
         (iVar1 = (*enc[3].getAtts)(enc,end_local,iVar1,(ATTRIBUTE *)end_local), iVar1 != 0)) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 4;
      iVar1 = extraout_EDX_04;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}